

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::FICDATAValueImpl::~FICDATAValueImpl(FICDATAValueImpl *this)

{
  FIStringValue::~FIStringValue((FIStringValue *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

inline FICDATAValueImpl(std::string &&value_) { value = std::move(value_); }